

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_qabs_s8_arm(CPUARMState *env,uint32_t x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = x >> 8;
  uVar1 = -x;
  if (-1 < (int)(x << 0x18)) {
    uVar1 = x;
  }
  uVar2 = x >> 0x10;
  uVar4 = -uVar5;
  if (-1 < (int)(uVar5 << 0x18)) {
    uVar4 = uVar5;
  }
  uVar5 = -uVar2;
  if (-1 < (int)(uVar2 << 0x18)) {
    uVar5 = uVar2;
  }
  iVar3 = (int)x >> 0x18;
  if (iVar3 == -0x80) {
    (env->vfp).qc[0] = 1;
    uVar2 = 0x7f000000;
  }
  else {
    uVar2 = -iVar3;
    if (-1 < iVar3) {
      uVar2 = x >> 0x18;
    }
    uVar2 = uVar2 << 0x18;
  }
  return (uVar4 & 0xff) << 8 | uVar1 & 0xff | (uVar5 & 0xff) << 0x10 | uVar2;
}

Assistant:

uint32_t HELPER(neon_qabs_s8)(CPUARMState *env, uint32_t x)
{
    neon_s8 vec;
    NEON_UNPACK(neon_s8, vec, x);
    DO_QABS8(vec.v1);
    DO_QABS8(vec.v2);
    DO_QABS8(vec.v3);
    DO_QABS8(vec.v4);
    NEON_PACK(neon_s8, x, vec);
    return x;
}